

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_read.cpp
# Opt level: O2

jtokentype getJsonToken(string *tokenVal,uint *consumed,char *raw,char *end)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  byte *pbVar7;
  jtokentype jVar8;
  uint codepoint_;
  long lVar9;
  char *__s1;
  byte *pbVar10;
  byte *pbVar11;
  long in_FS_OFFSET;
  JSONUTF8StringFilter writer;
  string numStr;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  tokenVal->_M_string_length = 0;
  *(tokenVal->_M_dataplus)._M_p = '\0';
  *consumed = 0;
  jVar8 = JTOK_ERR;
  for (lVar9 = 0; pbVar10 = (byte *)(raw + lVar9), pbVar10 < end; lVar9 = lVar9 + 1) {
    bVar3 = *pbVar10;
    if (1 < bVar3 - 9) {
      iVar5 = (int)lVar9;
      if (bVar3 - 0x20 < 0x1b) {
        paVar1 = &numStr.field_2;
        switch((uint)bVar3) {
        case 0x20:
          goto switchD_003da38f_caseD_20;
        default:
          goto switchD_003da38f_caseD_21;
        case 0x22:
          writer.str = &numStr;
          numStr._M_string_length = 0;
          writer.is_valid = true;
          writer.codepoint = 0;
          writer.state = 0;
          writer.surpair = 0;
          numStr.field_2._M_local_buf[0] = '\0';
          jVar8 = JTOK_ERR;
          numStr._M_dataplus._M_p = (pointer)paVar1;
          goto LAB_003da59a;
        case 0x2c:
          *consumed = iVar5 + 1;
          jVar8 = JTOK_COMMA;
          goto switchD_003da38f_caseD_21;
        case 0x2d:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          numStr._M_string_length = 0;
          numStr.field_2._M_local_buf[0] = '\0';
          pbVar11 = (byte *)(raw + lVar9 + 1);
          pbVar7 = pbVar11;
          if (bVar3 - 0x30 < 10) {
            pbVar7 = pbVar10;
          }
          if (((*pbVar7 == 0x30) &&
              (numStr._M_dataplus._M_p = (pointer)paVar1, (int)(char)pbVar7[1] - 0x30U < 10)) ||
             ((numStr._M_dataplus._M_p = (pointer)paVar1,
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back(&numStr,bVar3), pbVar11 < end && *pbVar10 == 0x2d &&
              (9 < (int)(char)*pbVar11 - 0x30U)))) {
            jVar8 = JTOK_ERR;
            goto switchD_003da61b_caseD_6f;
          }
          pbVar10 = (byte *)(raw + lVar9 + 2);
          goto LAB_003da414;
        case 0x3a:
          *consumed = iVar5 + 1;
          jVar8 = JTOK_COLON;
          goto switchD_003da38f_caseD_21;
        }
      }
      if (bVar3 != 0xd) {
        if (bVar3 == 0x5b) {
          *consumed = iVar5 + 1;
          jVar8 = JTOK_ARR_OPEN;
        }
        else if (bVar3 == 0x5d) {
          *consumed = iVar5 + 1;
          jVar8 = JTOK_ARR_CLOSE;
        }
        else if (((bVar3 == 0x66) || (bVar3 == 0x6e)) || (bVar3 == 0x74)) {
          __s1 = raw + lVar9;
          iVar4 = strncmp(__s1,"null",4);
          if (iVar4 == 0) {
            *consumed = iVar5 + 4;
            jVar8 = JTOK_KW_NULL;
          }
          else {
            iVar4 = strncmp(__s1,"true",4);
            if (iVar4 == 0) {
              *consumed = iVar5 + 4;
              jVar8 = JTOK_KW_TRUE;
            }
            else {
              iVar4 = strncmp(__s1,"false",5);
              if (iVar4 == 0) {
                *consumed = iVar5 + 5;
                jVar8 = JTOK_KW_FALSE;
              }
            }
          }
        }
        else if (bVar3 == 0x7b) {
          *consumed = iVar5 + 1;
          jVar8 = JTOK_OBJ_OPEN;
        }
        else if (bVar3 == 0x7d) {
          *consumed = iVar5 + 1;
          jVar8 = JTOK_OBJ_CLOSE;
        }
        goto switchD_003da38f_caseD_21;
      }
    }
switchD_003da38f_caseD_20:
  }
  jVar8 = JTOK_NONE;
  goto switchD_003da38f_caseD_21;
LAB_003da414:
  pbVar11 = pbVar10 + -1;
  if (pbVar11 < end) {
    bVar3 = *pbVar11;
    if ((int)(char)bVar3 - 0x30U < 10) goto LAB_003da42e;
    if (bVar3 == 0x2e) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&numStr,'.');
      jVar8 = JTOK_ERR;
      if ((end <= pbVar10) || (9 < (int)(char)*pbVar10 - 0x30U)) goto switchD_003da61b_caseD_6f;
      for (pbVar11 = pbVar10; (pbVar11 < end && ((int)(char)*pbVar11 - 0x30U < 10));
          pbVar11 = pbVar11 + 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&numStr,*pbVar11);
      }
    }
  }
  goto LAB_003da703;
LAB_003da42e:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&numStr,bVar3);
  pbVar10 = pbVar10 + 1;
  goto LAB_003da414;
LAB_003da703:
  if ((pbVar11 < end) && ((*pbVar11 | 0x20) == 0x65)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&numStr,*pbVar11);
    pbVar10 = pbVar11 + 1;
    if ((pbVar10 < end) && ((bVar3 = *pbVar10, bVar3 == 0x2d || (bVar3 == 0x2b)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&numStr,bVar3);
      pbVar10 = pbVar11 + 2;
    }
    pbVar11 = pbVar10;
    jVar8 = JTOK_ERR;
    if ((pbVar11 < end) && ((int)(char)*pbVar11 - 0x30U < 10)) {
      for (; (pbVar11 < end && ((int)(char)*pbVar11 - 0x30U < 10)); pbVar11 = pbVar11 + 1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&numStr,*pbVar11);
      }
      goto LAB_003da78e;
    }
  }
  else {
LAB_003da78e:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (tokenVal,&numStr);
    *consumed = (int)pbVar11 - (int)raw;
    jVar8 = JTOK_NUMBER;
  }
  goto switchD_003da61b_caseD_6f;
LAB_003da59a:
  pbVar11 = pbVar10 + 1;
  if ((end <= pbVar11) || (bVar3 = *pbVar11, bVar3 < 0x20)) goto switchD_003da61b_caseD_6f;
  if (bVar3 == 0x5c) {
    pbVar11 = pbVar10 + 2;
    if (end <= pbVar11) goto switchD_003da61b_caseD_6f;
    bVar3 = *pbVar11;
    switch(bVar3) {
    case 0x6e:
      bVar3 = 10;
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
      goto switchD_003da61b_caseD_6f;
    case 0x72:
      bVar3 = 0xd;
      break;
    case 0x74:
      bVar3 = 9;
      break;
    case 0x75:
      if (pbVar10 + 7 < end) goto code_r0x003da633;
      goto switchD_003da61b_caseD_6f;
    default:
      if ((bVar3 != 0x22) && (bVar3 != 0x2f)) {
        if (bVar3 == 0x66) {
          bVar3 = 0xc;
        }
        else if (bVar3 == 0x62) {
          bVar3 = 8;
        }
        else if (bVar3 != 0x5c) goto switchD_003da61b_caseD_6f;
      }
    }
    JSONUTF8StringFilter::push_back(&writer,bVar3);
    pbVar10 = pbVar11;
    goto LAB_003da59a;
  }
  goto code_r0x003da5ba;
code_r0x003da633:
  codepoint_ = 0;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    bVar3 = pbVar10[lVar9 + 3];
    iVar5 = (int)(char)bVar3;
    uVar6 = iVar5 - 0x30;
    if (9 < uVar6) {
      if ((byte)(bVar3 + 0x9f) < 6) {
        uVar6 = iVar5 - 0x57;
      }
      else {
        if (5 < (byte)(bVar3 + 0xbf)) goto switchD_003da61b_caseD_6f;
        uVar6 = iVar5 - 0x37;
      }
    }
    codepoint_ = codepoint_ * 0x10 + uVar6;
  }
  JSONUTF8StringFilter::push_back_u(&writer,codepoint_);
  pbVar10 = pbVar10 + 6;
  goto LAB_003da59a;
code_r0x003da5ba:
  if (bVar3 != 0x22) {
    JSONUTF8StringFilter::push_back(&writer,bVar3);
    pbVar10 = pbVar11;
    goto LAB_003da59a;
  }
  if ((writer.surpair == 0 && writer.state == 0) && ((writer.is_valid & 1U) != 0)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (tokenVal,&numStr);
    *consumed = ((int)pbVar10 + 2) - (int)raw;
    jVar8 = JTOK_STRING;
  }
switchD_003da61b_caseD_6f:
  std::__cxx11::string::~string((string *)&numStr);
switchD_003da38f_caseD_21:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return jVar8;
}

Assistant:

enum jtokentype getJsonToken(std::string& tokenVal, unsigned int& consumed,
                            const char *raw, const char *end)
{
    tokenVal.clear();
    consumed = 0;

    const char *rawStart = raw;

    while (raw < end && (json_isspace(*raw)))          // skip whitespace
        raw++;

    if (raw >= end)
        return JTOK_NONE;

    switch (*raw) {

    case '{':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_OBJ_OPEN;
    case '}':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_OBJ_CLOSE;
    case '[':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_ARR_OPEN;
    case ']':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_ARR_CLOSE;

    case ':':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_COLON;
    case ',':
        raw++;
        consumed = (raw - rawStart);
        return JTOK_COMMA;

    case 'n':
    case 't':
    case 'f':
        if (!strncmp(raw, "null", 4)) {
            raw += 4;
            consumed = (raw - rawStart);
            return JTOK_KW_NULL;
        } else if (!strncmp(raw, "true", 4)) {
            raw += 4;
            consumed = (raw - rawStart);
            return JTOK_KW_TRUE;
        } else if (!strncmp(raw, "false", 5)) {
            raw += 5;
            consumed = (raw - rawStart);
            return JTOK_KW_FALSE;
        } else
            return JTOK_ERR;

    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9': {
        // part 1: int
        std::string numStr;

        const char *first = raw;

        const char *firstDigit = first;
        if (!json_isdigit(*firstDigit))
            firstDigit++;
        if ((*firstDigit == '0') && json_isdigit(firstDigit[1]))
            return JTOK_ERR;

        numStr += *raw;                       // copy first char
        raw++;

        if ((*first == '-') && (raw < end) && (!json_isdigit(*raw)))
            return JTOK_ERR;

        while (raw < end && json_isdigit(*raw)) {  // copy digits
            numStr += *raw;
            raw++;
        }

        // part 2: frac
        if (raw < end && *raw == '.') {
            numStr += *raw;                   // copy .
            raw++;

            if (raw >= end || !json_isdigit(*raw))
                return JTOK_ERR;
            while (raw < end && json_isdigit(*raw)) { // copy digits
                numStr += *raw;
                raw++;
            }
        }

        // part 3: exp
        if (raw < end && (*raw == 'e' || *raw == 'E')) {
            numStr += *raw;                   // copy E
            raw++;

            if (raw < end && (*raw == '-' || *raw == '+')) { // copy +/-
                numStr += *raw;
                raw++;
            }

            if (raw >= end || !json_isdigit(*raw))
                return JTOK_ERR;
            while (raw < end && json_isdigit(*raw)) { // copy digits
                numStr += *raw;
                raw++;
            }
        }

        tokenVal = numStr;
        consumed = (raw - rawStart);
        return JTOK_NUMBER;
        }

    case '"': {
        raw++;                                // skip "

        std::string valStr;
        JSONUTF8StringFilter writer(valStr);

        while (true) {
            if (raw >= end || (unsigned char)*raw < 0x20)
                return JTOK_ERR;

            else if (*raw == '\\') {
                raw++;                        // skip backslash

                if (raw >= end)
                    return JTOK_ERR;

                switch (*raw) {
                case '"':  writer.push_back('\"'); break;
                case '\\': writer.push_back('\\'); break;
                case '/':  writer.push_back('/'); break;
                case 'b':  writer.push_back('\b'); break;
                case 'f':  writer.push_back('\f'); break;
                case 'n':  writer.push_back('\n'); break;
                case 'r':  writer.push_back('\r'); break;
                case 't':  writer.push_back('\t'); break;

                case 'u': {
                    unsigned int codepoint;
                    if (raw + 1 + 4 >= end ||
                        hatoui(raw + 1, raw + 1 + 4, codepoint) !=
                               raw + 1 + 4)
                        return JTOK_ERR;
                    writer.push_back_u(codepoint);
                    raw += 4;
                    break;
                    }
                default:
                    return JTOK_ERR;

                }

                raw++;                        // skip esc'd char
            }

            else if (*raw == '"') {
                raw++;                        // skip "
                break;                        // stop scanning
            }

            else {
                writer.push_back(static_cast<unsigned char>(*raw));
                raw++;
            }
        }

        if (!writer.finalize())
            return JTOK_ERR;
        tokenVal = valStr;
        consumed = (raw - rawStart);
        return JTOK_STRING;
        }

    default:
        return JTOK_ERR;
    }
}